

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

__pid_t __thiscall cimg_library::CImgDisplay::wait(CImgDisplay *this,void *__stat_loc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  timeval st_time;
  timespec local_28;
  
  if (this->_timer == 0) {
    gettimeofday((timeval *)&local_28,(__timezone_ptr_t)0x0);
    this->_timer = local_28.tv_sec * 1000 + local_28.tv_nsec / 1000;
  }
  gettimeofday((timeval *)&local_28,(__timezone_ptr_t)0x0);
  uVar3 = local_28.tv_sec * 1000 + local_28.tv_nsec / 1000;
  uVar1 = ((ulong)__stat_loc & 0xffffffff) + this->_timer;
  uVar2 = uVar1 - uVar3;
  if (uVar1 < uVar3 || uVar2 == 0) {
    this->_timer = uVar3;
  }
  else {
    uVar1 = uVar2 & 0xffffffff;
    this->_timer = uVar3 + uVar1;
    local_28.tv_sec = uVar1 / 1000;
    local_28.tv_nsec = (long)(uint)(((int)uVar2 + (int)(uVar1 / 1000) * -1000) * 1000000);
    nanosleep(&local_28,(timespec *)0x0);
  }
  return (__pid_t)this;
}

Assistant:

CImgDisplay& wait(const unsigned int milliseconds) {
      cimg::wait(milliseconds,&_timer);
      return *this;
    }